

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

bool google::anon_unknown_2::DoesSingleFlagMatch
               (CommandLineFlagInfo *flag,CompletionOptions *options,string *match_token)

{
  long lVar1;
  size_type pos;
  string *match_token_local;
  CompletionOptions *options_local;
  CommandLineFlagInfo *flag_local;
  
  lVar1 = std::__cxx11::string::find((string *)flag,(ulong)match_token);
  if (lVar1 == 0) {
    flag_local._7_1_ = true;
  }
  else if (((options->flag_name_substring_search & 1U) == 0) || (lVar1 == -1)) {
    if (((options->flag_location_substring_search & 1U) != 0) &&
       (lVar1 = std::__cxx11::string::find((string *)&flag->filename,(ulong)match_token),
       lVar1 != -1)) {
      return true;
    }
    if (((options->flag_description_substring_search & 1U) != 0) &&
       (lVar1 = std::__cxx11::string::find((string *)&flag->description,(ulong)match_token),
       lVar1 != -1)) {
      return true;
    }
    flag_local._7_1_ = false;
  }
  else {
    flag_local._7_1_ = true;
  }
  return flag_local._7_1_;
}

Assistant:

static bool DoesSingleFlagMatch(
    const CommandLineFlagInfo &flag,
    const CompletionOptions &options,
    const string &match_token) {
  // Is there a prefix match?
  string::size_type pos = flag.name.find(match_token);
  if (pos == 0) return true;

  // Is there a substring match if we want it?
  if (options.flag_name_substring_search &&
      pos != string::npos)
    return true;

  // Is there a location match if we want it?
  if (options.flag_location_substring_search &&
      flag.filename.find(match_token) != string::npos)
    return true;

  // TODO(user): All searches should probably be case-insensitive
  // (especially this one...)
  if (options.flag_description_substring_search &&
      flag.description.find(match_token) != string::npos)
    return true;

  return false;
}